

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

char * get_character_string(wchar_t codepoint)

{
  int iVar1;
  int iVar2;
  
  iVar1 = wctomb(get_character_string::result,codepoint);
  iVar2 = 0;
  if (iVar1 != -1) {
    iVar2 = iVar1;
  }
  ((char *)(long)iVar2)[0x154470] = '\0';
  return (char *)(long)iVar2;
}

Assistant:

static const char* get_character_string(int codepoint)
{
    // This assumes UTF-8, which is stupid
    static char result[6 + 1];

    int length = wctomb(result, codepoint);
    if (length == -1)
        length = 0;

    result[length] = '\0';
    return result;
}